

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64compiler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::a64::Compiler::onAttach(Compiler *this,CodeHolder *code)

{
  Error EVar1;
  undefined8 in_RSI;
  BaseEmitter *in_RDI;
  BaseCompiler *unaff_retaddr;
  Error err;
  Error _err;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  EVar1 = BaseCompiler::onAttach
                    (unaff_retaddr,
                     (CodeHolder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (EVar1 == 0) {
    EVar1 = BaseBuilder::addPassT<asmjit::v1_14::a64::ARMRAPass>
                      ((BaseBuilder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
    ;
    if (EVar1 == 0) {
      in_RDI->_instructionAlignment = '\x04';
      assignEmitterFuncs(in_RDI);
      EVar1 = 0;
    }
    else {
      (*in_RDI->_vptr_BaseEmitter[0x11])(in_RDI,in_RSI);
    }
  }
  return EVar1;
}

Assistant:

Error Compiler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));
  Error err = addPassT<ARMRAPass>();

  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  _instructionAlignment = uint8_t(4);
  assignEmitterFuncs(this);

  return kErrorOk;
}